

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_crypt.c
# Opt level: O0

int ulp_ring_encrypt(uint8_t *msg,ulp_ring_public_key *pub_key,ulp_ring_ciphertext **ciphertext_p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulp_ring_ciphertext *p2;
  void *__ptr;
  void *__ptr_00;
  uint64_t *out;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint8_t *in_RDI;
  size_t i_1;
  size_t i;
  int err;
  uint64_t *encoded;
  uint64_t *mul_tmp;
  uint64_t *e1;
  ulp_ring_ciphertext *ciphertext;
  size_t in_stack_ffffffffffffffa8;
  ulong uVar4;
  ulong local_50;
  
  if ((in_RDI != (uint8_t *)0x0) && (in_RSI != (uint64_t *)0x0)) {
    p2 = ulp_ring_alloc_ciphertext(in_stack_ffffffffffffffa8);
    __ptr = malloc(*in_RSI << 3);
    __ptr_00 = malloc(*in_RSI << 3);
    out = (uint64_t *)malloc(*in_RSI << 3);
    if ((p2 != (ulp_ring_ciphertext *)0x0) &&
       (((__ptr != (void *)0x0 && (__ptr_00 != (void *)0x0)) && (out != (uint64_t *)0x0)))) {
      iVar1 = get_random_numbers(in_RSI,(size_t)in_RDX,(uint64_t)p2);
      iVar2 = get_random_numbers(in_RSI,(size_t)in_RDX,(uint64_t)p2);
      iVar3 = get_random_numbers(in_RSI,(size_t)in_RDX,(uint64_t)p2);
      if (iVar3 + iVar2 + iVar1 == 0) {
        encode(in_RDI,out,*in_RSI,in_RSI[1]);
        iVar1 = poly_mulmod(in_RDX,&p2->n,(size_t)__ptr,(uint64_t)__ptr_00,out);
        if (iVar1 == 0) {
          for (local_50 = 0; local_50 < *in_RSI; local_50 = local_50 + 1) {
            p2->c1[local_50] =
                 (p2->c1[local_50] + *(long *)((long)__ptr_00 + local_50 * 8)) % in_RSI[1];
          }
          iVar1 = poly_mulmod(in_RDX,&p2->n,(size_t)__ptr,(uint64_t)__ptr_00,out);
          if (iVar1 == 0) {
            for (uVar4 = 0; uVar4 < *in_RSI; uVar4 = uVar4 + 1) {
              p2->c2[uVar4] =
                   (p2->c2[uVar4] + *(long *)((long)__ptr_00 + uVar4 * 8) + out[uVar4]) % in_RSI[1];
            }
            free(__ptr);
            free(__ptr_00);
            free(out);
            *in_RDX = (uint64_t)p2;
            return 0;
          }
        }
      }
    }
    ulp_ring_free_ciphertext((ulp_ring_ciphertext *)0x1015a3);
    free(__ptr);
    free(__ptr_00);
    free(out);
  }
  return -1;
}

Assistant:

int ulp_ring_encrypt(uint8_t msg[], ulp_ring_public_key* pub_key, ulp_ring_ciphertext** ciphertext_p) {

    if(msg == NULL || pub_key == NULL)
        return -1;

    // allocate memory for ciphertext and other buffers
    ulp_ring_ciphertext* ciphertext = ulp_ring_alloc_ciphertext(pub_key->n);
    uint64_t* e1 = malloc(pub_key->n * sizeof(pub_key->se));
    uint64_t* mul_tmp = malloc(pub_key->n * sizeof(pub_key->q));
    uint64_t* encoded = malloc(pub_key->n * sizeof(pub_key->q));
    if(ciphertext == NULL || e1 == NULL || mul_tmp == NULL || encoded == NULL)
        goto fail;

    // gather random data for e1, e2 and e3
    int err = 0;
    err += get_random_numbers(e1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c2, pub_key->n, pub_key->se);
    if(err != 0)
        goto fail;

    // encode input
    encode(msg, encoded, pub_key->n, pub_key->q);

    // c1 = a*e1 + e2
    if(poly_mulmod(pub_key->a, e1, pub_key->n, pub_key->q, mul_tmp) != 0)
        goto fail;
    for(size_t i = 0; i < pub_key->n; i++) {
        ciphertext->c1[i] = (ciphertext->c1[i] + mul_tmp[i]) % pub_key->q;
    }

    // c2 = p*e1 + e3 + encoded(msg)
    if(poly_mulmod(pub_key->p, e1, pub_key->n, pub_key->q, mul_tmp) != 0)
        goto fail;
    for(size_t i = 0; i < pub_key->n; i++) {
        ciphertext->c2[i] = (ciphertext->c2[i] + mul_tmp[i] + encoded[i]) % pub_key->q;
    }

    // exit properly
    free(e1);
    free(mul_tmp);
    free(encoded);
    *ciphertext_p = ciphertext;
    return 0;


    fail:
        ulp_ring_free_ciphertext(ciphertext);
        free(e1);
        free(mul_tmp);
        free(encoded);
        return -1;

}